

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O0

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextDataLine
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer,
          char continuationToken)

{
  value_type vVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  reference pvVar5;
  size_t sVar6;
  size_type local_30;
  size_t i;
  bool continuationFound;
  char continuationToken_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *this_local;
  
  std::vector<char,_std::allocator<char>_>::resize(buffer,this->m_cacheSize);
  if (((this->m_cachePos < this->m_cacheSize) && (this->m_filePos != 0)) ||
     (bVar3 = readNextBlock(this), bVar3)) {
    bVar3 = false;
    local_30 = 0;
    do {
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_cache,this->m_cachePos)
      ;
      if (continuationToken == *pvVar5) {
        bVar3 = true;
        this->m_cachePos = this->m_cachePos + 1;
      }
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_cache,this->m_cachePos)
      ;
      bVar4 = IsLineEnd<char>(*pvVar5);
      if (bVar4) {
        if (!bVar3) goto LAB_00758781;
        while (pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                                  (&this->m_cache,this->m_cachePos), *pvVar5 != '\n') {
          this->m_cachePos = this->m_cachePos + 1;
        }
        this->m_cachePos = this->m_cachePos + 1;
        bVar3 = false;
      }
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_cache,this->m_cachePos)
      ;
      vVar1 = *pvVar5;
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](buffer,local_30);
      *pvVar5 = vVar1;
      this->m_cachePos = this->m_cachePos + 1;
      local_30 = local_30 + 1;
      uVar2 = this->m_cachePos;
      sVar6 = size(this);
      if (sVar6 <= uVar2) {
LAB_00758781:
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](buffer,local_30);
        *pvVar5 = '\n';
        this->m_cachePos = this->m_cachePos + 1;
        return true;
      }
    } while ((this->m_cachePos < this->m_cacheSize) || (bVar4 = readNextBlock(this), bVar4));
  }
  return false;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::getNextDataLine( std::vector<T> &buffer, T continuationToken ) {
    buffer.resize( m_cacheSize );
    if ( m_cachePos >= m_cacheSize || 0 == m_filePos ) {
        if ( !readNextBlock() ) {
            return false;
        }
    }

    bool continuationFound( false );
    size_t i = 0;
    for( ;; ) {
        if ( continuationToken == m_cache[ m_cachePos ] ) {
            continuationFound = true;
            ++m_cachePos;
        }
        if ( IsLineEnd( m_cache[ m_cachePos ] ) ) {
            if ( !continuationFound ) {
                // the end of the data line
                break;
            } else {
                // skip line end
                while ( m_cache[m_cachePos] != '\n') {
                    ++m_cachePos;
                }
                ++m_cachePos;
                continuationFound = false;
            }
        }

        buffer[ i ] = m_cache[ m_cachePos ];
        ++m_cachePos;
        ++i;
        if (m_cachePos >= size()) {
            break;
        }
        if ( m_cachePos >= m_cacheSize ) {
            if ( !readNextBlock() ) {
                return false;
            }
        }
    }
    
    buffer[ i ] = '\n';
    ++m_cachePos;

    return true;
}